

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O0

CloseFrame * uWS::protocol::parseClosePayload(char *src,size_t length)

{
  bool bVar1;
  unsigned_short uVar2;
  ulong in_RDX;
  unsigned_short *in_RSI;
  CloseFrame *in_RDI;
  CloseFrame cf;
  undefined6 uStack_3e;
  undefined8 local_28;
  unsigned_short *local_20;
  size_t local_18;
  ulong local_10;
  unsigned_short *local_8;
  
  local_10 = in_RDX;
  local_8 = in_RSI;
  memset(&local_28,0,0x18);
  if (1 < local_10) {
    local_28 = CONCAT62(local_28._2_6_,*local_8);
    uVar2 = cond_byte_swap<unsigned_short>(*local_8);
    local_20 = local_8 + 1;
    local_18 = local_10 - 2;
    local_28 = CONCAT62(uStack_3e,uVar2);
    if ((((uVar2 < 1000) || (4999 < uVar2)) || ((0x3f3 < uVar2 && (uVar2 < 4000)))) ||
       (((0x3eb < uVar2 && (uVar2 < 0x3ef)) ||
        (bVar1 = isValidUtf8((uchar *)local_20,local_18), !bVar1)))) {
      memset(in_RDI,0,0x18);
      return in_RDI;
    }
  }
  *(undefined8 *)in_RDI = local_28;
  in_RDI->message = (char *)local_20;
  in_RDI->length = local_18;
  return in_RDI;
}

Assistant:

static inline CloseFrame parseClosePayload(char *src, size_t length) {
    CloseFrame cf = {};
    if (length >= 2) {
        memcpy(&cf.code, src, 2);
        cf = {cond_byte_swap<uint16_t>(cf.code), src + 2, length - 2};
        if (cf.code < 1000 || cf.code > 4999 || (cf.code > 1011 && cf.code < 4000) ||
            (cf.code >= 1004 && cf.code <= 1006) || !isValidUtf8((unsigned char *) cf.message, cf.length)) {
            return {};
        }
    }
    return cf;
}